

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionSwapTest_LhsCleared_Test::TestBody
          (GeneratedMessageReflectionSwapTest_LhsCleared_Test *this)

{
  Message *in_RCX;
  Metadata MVar1;
  TestAllTypes lhs;
  TestAllTypes rhs;
  TestAllTypes TStack_688;
  TestAllTypes local_348;
  
  proto2_unittest::TestAllTypes::TestAllTypes(&TStack_688,(Arena *)0x0);
  proto2_unittest::TestAllTypes::TestAllTypes(&local_348,(Arena *)0x0);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(&TStack_688);
  proto2_unittest::TestAllTypes::Clear(&TStack_688);
  MVar1 = proto2_unittest::TestAllTypes::GetMetadata
                    ((TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_);
  GeneratedMessageReflectionSwapTest::Swap
            ((GeneratedMessageReflectionSwapTest *)MVar1.reflection,(Reflection *)&TStack_688,
             &local_348.super_Message,in_RCX);
  TestUtil::ExpectClear<proto2_unittest::TestAllTypes>(&local_348);
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_348);
  proto2_unittest::TestAllTypes::~TestAllTypes(&TStack_688);
  return;
}

Assistant:

TEST_P(GeneratedMessageReflectionSwapTest, LhsCleared) {
  unittest::TestAllTypes lhs;
  unittest::TestAllTypes rhs;

  TestUtil::SetAllFields(&lhs);

  // For proto2 message, for message field, Clear only reset hasbits, but
  // doesn't delete the underlying field.
  lhs.Clear();

  Swap(lhs.GetReflection(), &lhs, &rhs);

  TestUtil::ExpectClear(rhs);
}